

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::grabMouse(QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  char *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *in_stack_00000028;
  char *pcVar2;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  QGraphicsScenePrivate *in_stack_ffffffffffffffc0;
  char local_28 [32];
  long local_8;
  int line;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = in_RDI;
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 8));
  line = (int)((ulong)pcVar2 >> 0x20);
  if (pQVar1->scene == (QGraphicsScene *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffffc0,
               (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),line,in_RDI);
    QMessageLogger::warning(local_28,"QGraphicsItem::grabMouse: cannot grab mouse without scene");
  }
  else {
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)(in_RDI + 8));
    if ((*(ulong *)&pQVar1->field_0x160 >> 5 & 1) == 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_ffffffffffffffc0,
                 (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),line,in_RDI);
      QMessageLogger::warning
                (&stack0xffffffffffffffb8,
                 "QGraphicsItem::grabMouse: cannot grab mouse while invisible");
    }
    else {
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                  *)(in_RDI + 8));
      QGraphicsScene::d_func((QGraphicsScene *)0x97d4b1);
      QGraphicsScenePrivate::grabMouse
                (in_stack_ffffffffffffffc0,in_stack_00000028,(bool)in_stack_ffffffffffffffbf);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::grabMouse()
{
    if (!d_ptr->scene) {
        qWarning("QGraphicsItem::grabMouse: cannot grab mouse without scene");
        return;
    }
    if (!d_ptr->visible) {
        qWarning("QGraphicsItem::grabMouse: cannot grab mouse while invisible");
        return;
    }
    d_ptr->scene->d_func()->grabMouse(this);
}